

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_curve_to
               (nk_draw_list *list,nk_vec2 p2,nk_vec2 p3,nk_vec2 p4,uint num_segments)

{
  nk_vec2 pos;
  uint in_ESI;
  long in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float x_00;
  undefined8 in_XMM0_Qa;
  nk_vec2 nVar5;
  nk_vec2 list_00;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float in_XMM2_Da;
  float in_XMM2_Db;
  float y;
  float x;
  float w4;
  float w3;
  float w2;
  float w1;
  float u;
  float t;
  nk_vec2 p1;
  uint i_step;
  float t_step;
  uint local_6c;
  nk_draw_list *in_stack_ffffffffffffff98;
  float local_38;
  float fStack_34;
  uint local_2c;
  float local_8;
  float fStack_4;
  
  if ((in_RDI != 0) && (*(int *)(in_RDI + 0xe0) != 0)) {
    local_6c = in_ESI;
    if (in_ESI == 0) {
      local_6c = 1;
    }
    nVar5 = nk_draw_list_path_last(in_stack_ffffffffffffff98);
    for (local_2c = 1; local_2c <= local_6c; local_2c = local_2c + 1) {
      fVar1 = (1.0 / (float)local_6c) * (float)local_2c;
      fVar2 = 1.0 - fVar1;
      fVar3 = fVar2 * fVar2 * fVar2;
      fVar4 = fVar2 * 3.0 * fVar2 * fVar1;
      fVar2 = fVar2 * 3.0 * fVar1 * fVar1;
      fVar1 = fVar1 * fVar1 * fVar1;
      local_38 = nVar5.x;
      local_8 = (float)in_XMM0_Qa;
      x_00 = fVar1 * in_XMM2_Da + fVar2 * in_XMM1_Da + fVar3 * local_38 + fVar4 * local_8;
      fStack_34 = nVar5.y;
      fStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
      fVar2 = fVar1 * in_XMM2_Db + fVar2 * in_XMM1_Db + fVar3 * fStack_34 + fVar4 * fStack_4;
      list_00 = nk_vec2(x_00,fVar2);
      pos.y = x_00;
      pos.x = fVar2;
      nk_draw_list_path_line_to((nk_draw_list *)list_00,pos);
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_curve_to(struct nk_draw_list *list, struct nk_vec2 p2,
struct nk_vec2 p3, struct nk_vec2 p4, unsigned int num_segments)
{
float t_step;
unsigned int i_step;
struct nk_vec2 p1;

NK_ASSERT(list);
NK_ASSERT(list->path_count);
if (!list || !list->path_count) return;
num_segments = NK_MAX(num_segments, 1);

p1 = nk_draw_list_path_last(list);
t_step = 1.0f/(float)num_segments;
for (i_step = 1; i_step <= num_segments; ++i_step) {
float t = t_step * (float)i_step;
float u = 1.0f - t;
float w1 = u*u*u;
float w2 = 3*u*u*t;
float w3 = 3*u*t*t;
float w4 = t * t *t;
float x = w1 * p1.x + w2 * p2.x + w3 * p3.x + w4 * p4.x;
float y = w1 * p1.y + w2 * p2.y + w3 * p3.y + w4 * p4.y;
nk_draw_list_path_line_to(list, nk_vec2(x,y));
}
}